

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial.h
# Opt level: O2

SpatialBinInfo<16UL,_embree::PrimRef> * __thiscall
embree::avx::SpatialBinInfo<16UL,_embree::PrimRef>::operator=
          (SpatialBinInfo<16UL,_embree::PrimRef> *this,
          SpatialBinInfo<16UL,_embree::PrimRef> *param_1)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  Vec3fa *pVVar4;
  Vec3fa *pVVar5;
  long lVar6;
  long lVar7;
  
  pVVar4 = &param_1->bounds[0][0].upper;
  pVVar5 = &this->bounds[0][0].upper;
  for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
    for (lVar7 = 0; lVar7 != 0x60; lVar7 = lVar7 + 0x20) {
      puVar1 = (undefined8 *)((long)&(((BBox3fa *)(pVVar4 + -1))->lower).field_0 + lVar7);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(((BBox3fa *)(pVVar5 + -1))->lower).field_0 + lVar7);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      puVar1 = (undefined8 *)((long)&pVVar4->field_0 + lVar7);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pVVar5->field_0 + lVar7);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
    }
    pVVar4 = pVVar4 + 6;
    pVVar5 = pVVar5 + 6;
  }
  for (lVar6 = 0x600; lVar6 != 0x700; lVar6 = lVar6 + 0x10) {
    puVar1 = (undefined8 *)((long)&param_1->bounds[0][0].lower.field_0 + lVar6);
    uVar3 = puVar1[1];
    puVar2 = (undefined8 *)((long)&this->bounds[0][0].lower.field_0 + lVar6);
    *puVar2 = *puVar1;
    puVar2[1] = uVar3;
  }
  for (lVar6 = 0x700; lVar6 != 0x800; lVar6 = lVar6 + 0x10) {
    puVar1 = (undefined8 *)((long)&param_1->bounds[0][0].lower.field_0 + lVar6);
    uVar3 = puVar1[1];
    puVar2 = (undefined8 *)((long)&this->bounds[0][0].lower.field_0 + lVar6);
    *puVar2 = *puVar1;
    puVar2[1] = uVar3;
  }
  return this;
}

Assistant:

struct __aligned(64) SpatialBinInfo
    {
      SpatialBinInfo() {
      }